

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O1

void nni_sock_bump_tx(nni_sock *s,uint64_t sz)

{
  nni_stat_inc(&s->st_tx_msgs,1);
  nni_stat_inc(&s->st_tx_bytes,sz);
  return;
}

Assistant:

void
nni_sock_bump_tx(nni_sock *s, uint64_t sz)
{
#ifdef NNG_ENABLE_STATS
	nni_stat_inc(&s->st_tx_msgs, 1);
	nni_stat_inc(&s->st_tx_bytes, sz);
#else
	NNI_ARG_UNUSED(s);
	NNI_ARG_UNUSED(sz);
#endif
}